

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcontrollers.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CSynchStateController::IncrementSignalCount
          (CSynchStateController *this,LONG lAmountToIncrement)

{
  LONG LVar1;
  CPalThread *pCVar2;
  LONG lNewCount;
  LONG lOldCount;
  LONG lAmountToIncrement_local;
  CSynchStateController *this_local;
  
  pCVar2 = InternalGetCurrentThread();
  if (pCVar2 != (this->super_CSynchControllerBase).m_pthrOwner) {
    fprintf(_stderr,"] %s %s:%d","IncrementSignalCount",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x247);
    fprintf(_stderr,"Expression: InternalGetCurrentThread() == m_pthrOwner\n");
  }
  if (lAmountToIncrement < 1) {
    fprintf(_stderr,"] %s %s:%d","IncrementSignalCount",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x248);
    fprintf(_stderr,"Expression: lAmountToIncrement > 0\n");
  }
  LVar1 = CSynchData::GetSignalCount((this->super_CSynchControllerBase).m_psdSynchData);
  if (LVar1 + lAmountToIncrement <= LVar1) {
    fprintf(_stderr,"] %s %s:%d","IncrementSignalCount",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x24f);
    fprintf(_stderr,
            "Expression: lNewCount > lOldCount, Description: Signal count increment %d would make current signal count %d to wrap around\n"
            ,(ulong)(uint)lAmountToIncrement);
  }
  CSynchData::Signal((this->super_CSynchControllerBase).m_psdSynchData,
                     (this->super_CSynchControllerBase).m_pthrOwner,LVar1 + lAmountToIncrement,false
                    );
  return 0;
}

Assistant:

PAL_ERROR CSynchStateController::IncrementSignalCount(
        LONG lAmountToIncrement)
    {
        VALIDATEOBJECT(m_psdSynchData);

        _ASSERTE(InternalGetCurrentThread() == m_pthrOwner);
        _ASSERTE(lAmountToIncrement > 0);

        LONG lOldCount = m_psdSynchData->GetSignalCount();
        LONG lNewCount = lOldCount + lAmountToIncrement;

        _ASSERT_MSG(lNewCount > lOldCount,
            "Signal count increment %d would make current signal count %d to "
            "wrap around\n", lAmountToIncrement, lOldCount);
        
        m_psdSynchData->Signal(m_pthrOwner, lNewCount, false);

        return NO_ERROR;
    }